

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

int vkt::clipping::anon_unknown_0::countPixels
              (ConstPixelBufferAccess *pixels,IVec2 *regionOffset,IVec2 *regionSize,Vec4 *color,
              Vec4 *colorThreshold)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined1 local_74 [24];
  int x;
  int y;
  int numPixels;
  int yEnd;
  int xEnd;
  Vec4 maxColor;
  Vec4 minColor;
  Vec4 *colorThreshold_local;
  Vec4 *color_local;
  IVec2 *regionSize_local;
  IVec2 *regionOffset_local;
  ConstPixelBufferAccess *pixels_local;
  
  tcu::operator-((tcu *)(maxColor.m_data + 2),color,colorThreshold);
  tcu::operator+((tcu *)&yEnd,color,colorThreshold);
  iVar2 = tcu::Vector<int,_2>::x(regionOffset);
  iVar3 = tcu::Vector<int,_2>::x(regionSize);
  numPixels = iVar2 + iVar3;
  iVar2 = tcu::Vector<int,_2>::y(regionOffset);
  iVar3 = tcu::Vector<int,_2>::y(regionSize);
  y = iVar2 + iVar3;
  x = 0;
  for (local_74._20_4_ = tcu::Vector<int,_2>::y(regionOffset); (int)local_74._20_4_ < y;
      local_74._20_4_ = local_74._20_4_ + 1) {
    for (local_74._16_4_ = tcu::Vector<int,_2>::x(regionOffset); (int)local_74._16_4_ < numPixels;
        local_74._16_4_ = local_74._16_4_ + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_74,(int)pixels,local_74._16_4_,local_74._20_4_);
      bVar1 = isColorInRange((Vec4 *)local_74,(Vec4 *)(maxColor.m_data + 2),(Vec4 *)&yEnd);
      if (bVar1) {
        x = x + 1;
      }
    }
  }
  return x;
}

Assistant:

int countPixels (const tcu::ConstPixelBufferAccess pixels, const IVec2& regionOffset, const IVec2& regionSize, const Vec4& color, const Vec4& colorThreshold)
{
	const Vec4	minColor	= color - colorThreshold;
	const Vec4	maxColor	= color + colorThreshold;
	const int	xEnd		= regionOffset.x() + regionSize.x();
	const int	yEnd		= regionOffset.y() + regionSize.y();
	int			numPixels	= 0;

	DE_ASSERT(xEnd <= pixels.getWidth());
	DE_ASSERT(yEnd <= pixels.getHeight());

	for (int y = regionOffset.y(); y < yEnd; ++y)
	for (int x = regionOffset.x(); x < xEnd; ++x)
	{
		if (isColorInRange(pixels.getPixel(x, y), minColor, maxColor))
			++numPixels;
	}

	return numPixels;
}